

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_> *
__thiscall
Json::OurReader::getStructuredErrors
          (vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
           *__return_storage_ptr__,OurReader *this)

{
  Location pCVar1;
  _Elt_pointer pEVar2;
  _Elt_pointer pEVar3;
  undefined1 auVar4 [16];
  _Map_pointer local_70;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar3 = (this->errors_).
           super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pEVar2 = (this->errors_).
           super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_70 = (this->errors_).
             super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  while (pEVar3 != (this->errors_).
                   super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    pCVar1 = this->begin_;
    auVar4._8_4_ = (int)pCVar1;
    auVar4._0_8_ = pCVar1;
    auVar4._12_4_ = (int)((ulong)pCVar1 >> 0x20);
    local_68._0_8_ = (long)(pEVar3->token_).start_ - (long)pCVar1;
    local_68._8_8_ = (long)(pEVar3->token_).end_ - auVar4._8_8_;
    std::__cxx11::string::_M_assign((string *)&local_58);
    std::vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_68);
    std::__cxx11::string::~string((string *)&local_58);
    pEVar3 = pEVar3 + 1;
    if (pEVar3 == pEVar2) {
      pEVar3 = local_70[1];
      local_70 = local_70 + 1;
      pEVar2 = pEVar3 + 8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<OurReader::StructuredError> OurReader::getStructuredErrors() const {
  std::vector<OurReader::StructuredError> allErrors;
  for (Errors::const_iterator itError = errors_.begin();
       itError != errors_.end();
       ++itError) {
    const ErrorInfo& error = *itError;
    OurReader::StructuredError structured;
    structured.offset_start = error.token_.start_ - begin_;
    structured.offset_limit = error.token_.end_ - begin_;
    structured.message = error.message_;
    allErrors.push_back(structured);
  }
  return allErrors;
}